

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walltime.cc
# Opt level: O3

WallTime benchmark::walltime::Now(void)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  WallTimeImp *pWVar4;
  undefined8 in_RAX;
  undefined4 extraout_var;
  long lVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  uint32_t uVar9;
  WallTime WVar10;
  timeval tv;
  timeval local_38;
  
  uVar6 = CONCAT71((int7)((ulong)in_RAX >> 8),Now()::useCPUClock);
  if ((Now()::useCPUClock == '\0') &&
     (uVar6 = __cxa_guard_acquire(&Now()::useCPUClock), (int)uVar6 != 0)) {
    Now::useCPUClock = anon_unknown_1::UseCpuCycleClock();
    uVar6 = __cxa_guard_release(&Now()::useCPUClock);
  }
  if (Now::useCPUClock == true) {
    uVar7 = CONCAT71((int7)((ulong)uVar6 >> 8),(anonymous_namespace)::CPUWalltimeNow()::imp);
    if (((anonymous_namespace)::CPUWalltimeNow()::imp == '\0') &&
       (uVar7 = __cxa_guard_acquire(&(anonymous_namespace)::CPUWalltimeNow()::imp), (int)uVar7 != 0)
       ) {
      (anonymous_namespace)::CPUWalltimeNow()::imp = anon_unknown_1::WallTimeImp::GetWallTimeImp();
      uVar7 = __cxa_guard_release(&(anonymous_namespace)::CPUWalltimeNow()::imp);
    }
    pWVar4 = (anonymous_namespace)::CPUWalltimeNow()::imp;
    do {
      uVar8 = rdtsc();
      uVar8 = uVar8 & 0xffffffff00000000 | CONCAT44((int)(uVar7 >> 0x20),(int)uVar8);
      lVar5 = pWVar4->base_cycletime_;
      dVar1 = pWVar4->base_walltime_;
      dVar2 = pWVar4->seconds_per_cycle_;
      uVar9 = (uint32_t)(uVar8 >> 0x20);
      if (pWVar4->last_adjust_time_ == uVar9) {
        return (double)(float)(pWVar4->drift_adjust_).super___atomic_base<int>._M_i +
               (double)(long)(uVar8 - lVar5) * dVar2 + dVar1;
      }
      gettimeofday(&local_38,(__timezone_ptr_t)0x0);
      uVar3 = rdtsc();
      uVar7 = CONCAT44(extraout_var,(int)uVar3);
    } while (pWVar4->max_interval_cycles_ < (long)((uVar3 & 0xffffffff00000000 | uVar7) - uVar8));
    WVar10 = (double)local_38.tv_usec * 1e-06 + (double)local_38.tv_sec;
    LOCK();
    (pWVar4->drift_adjust_).super___atomic_base<int>._M_i =
         (__int_type)(float)(WVar10 - ((double)(long)(uVar8 - lVar5) * dVar2 + dVar1));
    UNLOCK();
    pWVar4->last_adjust_time_ = uVar9;
  }
  else {
    lVar5 = std::chrono::_V2::steady_clock::now();
    WVar10 = (double)lVar5 / 1000000000.0;
  }
  return WVar10;
}

Assistant:

WallTime Now()
{
  static bool useCPUClock = UseCpuCycleClock();
  if (useCPUClock) {
    return CPUWalltimeNow();
  } else {
    return ChronoWalltimeNow();
  }
}